

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecs.cpp
# Opt level: O0

void __thiscall codecs_base64_decode_buffer_Test::TestBody(codecs_base64_decode_buffer_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_970;
  Message local_968;
  buffer<char> local_960;
  buffer<char> local_940;
  undefined1 local_920 [8];
  AssertionResult gtest_ar_26;
  Message local_908;
  string local_900;
  ST_ssize_t local_8e0;
  long local_8d8;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar_25;
  Message local_8b8;
  string local_8b0;
  ST_ssize_t local_890;
  long local_888;
  undefined1 local_880 [8];
  AssertionResult gtest_ar_24;
  Message local_868;
  buffer<char> local_860;
  buffer<char> local_840;
  undefined1 local_820 [8];
  AssertionResult gtest_ar_23;
  Message local_808;
  string local_800;
  ST_ssize_t local_7e0;
  long local_7d8;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_22;
  Message local_7b8;
  string local_7b0;
  ST_ssize_t local_790;
  long local_788;
  undefined1 local_780 [8];
  AssertionResult gtest_ar_21;
  Message local_768;
  buffer<char> local_760;
  buffer<char> local_740;
  undefined1 local_720 [8];
  AssertionResult gtest_ar_20;
  Message local_708;
  string local_700;
  ST_ssize_t local_6e0;
  long local_6d8;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar_19;
  Message local_6b8;
  string local_6b0;
  ST_ssize_t local_690;
  long local_688;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_18;
  Message local_668;
  buffer<char> local_660;
  buffer<char> local_640;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_17;
  Message local_608;
  string local_600;
  ST_ssize_t local_5e0;
  long local_5d8;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_16;
  Message local_5b8;
  string local_5b0;
  ST_ssize_t local_590;
  long local_588;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_15;
  Message local_568;
  buffer<char> local_560;
  buffer<char> local_540;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_14;
  Message local_508;
  string local_500;
  ST_ssize_t local_4e0;
  long local_4d8;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_13;
  Message local_4b8;
  string local_4b0;
  ST_ssize_t local_490;
  long local_488;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_12;
  Message local_468;
  buffer<char> local_460;
  buffer<char> local_440;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_11;
  Message local_408;
  string local_400;
  ST_ssize_t local_3e0;
  long local_3d8;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_10;
  Message local_3b8;
  string local_3b0;
  ST_ssize_t local_390;
  long local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_9;
  Message local_368;
  buffer<char> local_360;
  buffer<char> local_340;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_8;
  Message local_308;
  string local_300;
  ST_ssize_t local_2e0;
  long local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_7;
  Message local_2b8;
  string local_2b0;
  ST_ssize_t local_290;
  long local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_6;
  char tight_buffer [4];
  Message local_260;
  buffer<char> local_258;
  buffer<char> local_238;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_5;
  Message local_200;
  string local_1f8;
  ST_ssize_t local_1d8;
  long local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_4;
  Message local_1b0;
  string local_1a8;
  ST_ssize_t local_188;
  long local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_3;
  Message local_160;
  buffer<char> local_158;
  buffer<char> local_138;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  Message local_100;
  string local_f8;
  ST_ssize_t local_d8;
  int local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  Message local_b0 [3];
  string local_98;
  ST_ssize_t local_78;
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  char buffer [64];
  codecs_base64_decode_buffer_Test *this_local;
  
  local_6c = 0;
  ST::string::string(&local_98);
  local_78 = ST::base64_decode(&local_98,(void *)0x0,0);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_68,"0","ST::base64_decode(ST::string(), nullptr, 0)",&local_6c,
             &local_78);
  ST::string::~string(&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_cc = 0;
  ST::string::string(&local_f8);
  local_d8 = ST::base64_decode(&local_f8,&gtest_ar.message_,0x40);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_c8,"0","ST::base64_decode(ST::string(), buffer, sizeof(buffer))",
             &local_cc,&local_d8);
  ST::string::~string(&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xee,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  ST::buffer<char>::buffer(&local_138,(char *)"",0);
  ST::buffer<char>::buffer(&local_158,(char *)&gtest_ar.message_,0);
  testing::internal::EqHelper::Compare<ST::buffer<char>,_ST::buffer<char>,_nullptr>
            ((EqHelper *)local_118,"ST::char_buffer(reinterpret_cast<const char *>(data_empty), 0)",
             "ST::char_buffer(buffer, 0)",&local_138,&local_158);
  ST::buffer<char>::~buffer(&local_158);
  ST::buffer<char>::~buffer(&local_138);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_180 = 0x30;
  ST::string::from_validated
            (&local_1a8,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",0x40);
  local_188 = ST::base64_decode(&local_1a8,(void *)0x0,0);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_178,"static_cast<ST_ssize_t>(sizeof(data_base64_ranges))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/\" \"\", sizeof(\"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/\") - 1), nullptr, 0)"
             ,&local_180,&local_188);
  ST::string::~string(&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xf3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  local_1d0 = 0x30;
  ST::string::from_validated
            (&local_1f8,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",0x40);
  local_1d8 = ST::base64_decode(&local_1f8,&gtest_ar.message_,0x40);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_1c8,"static_cast<ST_ssize_t>(sizeof(data_base64_ranges))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/\" \"\", sizeof(\"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/\") - 1), buffer, sizeof(buffer))"
             ,&local_1d0,&local_1d8);
  ST::string::~string(&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  ST::buffer<char>::buffer(&local_238,(char *)"",0x30);
  ST::buffer<char>::buffer(&local_258,(char *)&gtest_ar.message_,0x30);
  testing::internal::EqHelper::Compare<ST::buffer<char>,_ST::buffer<char>,_nullptr>
            ((EqHelper *)local_218,
             "ST::char_buffer(reinterpret_cast<const char *>(data_base64_ranges), sizeof((data_base64_ranges)))"
             ,"ST::char_buffer(buffer, sizeof(data_base64_ranges))",&local_238,&local_258);
  ST::buffer<char>::~buffer(&local_258);
  ST::buffer<char>::~buffer(&local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffd98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffd98,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd98);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_288 = 4;
  ST::string::from_validated(&local_2b0,"AQIDBA==",8);
  local_290 = ST::base64_decode(&local_2b0,(void *)0x0,0);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_280,"static_cast<ST_ssize_t>(sizeof(tight_buffer))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBA==\" \"\", sizeof(\"AQIDBA==\") - 1), nullptr, 0)"
             ,&local_288,&local_290);
  ST::string::~string(&local_2b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_2b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_280);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xfb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  local_2d8 = 4;
  ST::string::from_validated(&local_300,"AQIDBA==",8);
  local_2e0 = ST::base64_decode(&local_300,
                                (void *)((long)&gtest_ar_6.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        + 4),4);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_2d0,"static_cast<ST_ssize_t>(sizeof(tight_buffer))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBA==\" \"\", sizeof(\"AQIDBA==\") - 1), tight_buffer, sizeof(tight_buffer))"
             ,&local_2d8,&local_2e0);
  ST::string::~string(&local_300);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  ST::buffer<char>::buffer(&local_340,(char *)"\x01\x02\x03\x04",4);
  ST::buffer<char>::buffer
            (&local_360,
             (char *)((long)&gtest_ar_6.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 4),4);
  testing::internal::EqHelper::Compare<ST::buffer<char>,_ST::buffer<char>,_nullptr>
            ((EqHelper *)local_320,
             "ST::char_buffer(reinterpret_cast<const char *>(data_4), sizeof((data_4)))",
             "ST::char_buffer(tight_buffer, sizeof(tight_buffer))",&local_340,&local_360);
  ST::buffer<char>::~buffer(&local_360);
  ST::buffer<char>::~buffer(&local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  local_388 = 1;
  ST::string::from_validated(&local_3b0,"AQ==",4);
  local_390 = ST::base64_decode(&local_3b0,(void *)0x0,0);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_380,"static_cast<ST_ssize_t>(sizeof(data_1))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQ==\" \"\", sizeof(\"AQ==\") - 1), nullptr, 0)"
             ,&local_388,&local_390);
  ST::string::~string(&local_3b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x101,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  local_3d8 = 1;
  ST::string::from_validated(&local_400,"AQ==",4);
  local_3e0 = ST::base64_decode(&local_400,&gtest_ar.message_,0x40);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_3d0,"static_cast<ST_ssize_t>(sizeof(data_1))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQ==\" \"\", sizeof(\"AQ==\") - 1), buffer, sizeof(buffer))"
             ,&local_3d8,&local_3e0);
  ST::string::~string(&local_400);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x103,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  ST::buffer<char>::buffer(&local_440,(char *)"\x01",1);
  ST::buffer<char>::buffer(&local_460,(char *)&gtest_ar.message_,1);
  testing::internal::EqHelper::Compare<ST::buffer<char>,_ST::buffer<char>,_nullptr>
            ((EqHelper *)local_420,
             "ST::char_buffer(reinterpret_cast<const char *>(data_1), sizeof((data_1)))",
             "ST::char_buffer(buffer, sizeof(data_1))",&local_440,&local_460);
  ST::buffer<char>::~buffer(&local_460);
  ST::buffer<char>::~buffer(&local_440);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x104,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  local_488 = 2;
  ST::string::from_validated(&local_4b0,"AQI=",4);
  local_490 = ST::base64_decode(&local_4b0,(void *)0x0,0);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_480,"static_cast<ST_ssize_t>(sizeof(data_2))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQI=\" \"\", sizeof(\"AQI=\") - 1), nullptr, 0)"
             ,&local_488,&local_490);
  ST::string::~string(&local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x106,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  local_4d8 = 2;
  ST::string::from_validated(&local_500,"AQI=",4);
  local_4e0 = ST::base64_decode(&local_500,&gtest_ar.message_,0x40);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_4d0,"static_cast<ST_ssize_t>(sizeof(data_2))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQI=\" \"\", sizeof(\"AQI=\") - 1), buffer, sizeof(buffer))"
             ,&local_4d8,&local_4e0);
  ST::string::~string(&local_500);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x108,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  ST::buffer<char>::buffer(&local_540,(char *)"\x01\x02",2);
  ST::buffer<char>::buffer(&local_560,(char *)&gtest_ar.message_,2);
  testing::internal::EqHelper::Compare<ST::buffer<char>,_ST::buffer<char>,_nullptr>
            ((EqHelper *)local_520,
             "ST::char_buffer(reinterpret_cast<const char *>(data_2), sizeof((data_2)))",
             "ST::char_buffer(buffer, sizeof(data_2))",&local_540,&local_560);
  ST::buffer<char>::~buffer(&local_560);
  ST::buffer<char>::~buffer(&local_540);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x109,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  local_588 = 3;
  ST::string::from_validated(&local_5b0,"AQID",4);
  local_590 = ST::base64_decode(&local_5b0,(void *)0x0,0);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_580,"static_cast<ST_ssize_t>(sizeof(data_3))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQID\" \"\", sizeof(\"AQID\") - 1), nullptr, 0)"
             ,&local_588,&local_590);
  ST::string::~string(&local_5b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x10b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  local_5d8 = 3;
  ST::string::from_validated(&local_600,"AQID",4);
  local_5e0 = ST::base64_decode(&local_600,&gtest_ar.message_,0x40);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_5d0,"static_cast<ST_ssize_t>(sizeof(data_3))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQID\" \"\", sizeof(\"AQID\") - 1), buffer, sizeof(buffer))"
             ,&local_5d8,&local_5e0);
  ST::string::~string(&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x10d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  ST::buffer<char>::buffer(&local_640,(char *)"\x01\x02\x03",3);
  ST::buffer<char>::buffer(&local_660,(char *)&gtest_ar.message_,3);
  testing::internal::EqHelper::Compare<ST::buffer<char>,_ST::buffer<char>,_nullptr>
            ((EqHelper *)local_620,
             "ST::char_buffer(reinterpret_cast<const char *>(data_3), sizeof((data_3)))",
             "ST::char_buffer(buffer, sizeof(data_3))",&local_640,&local_660);
  ST::buffer<char>::~buffer(&local_660);
  ST::buffer<char>::~buffer(&local_640);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_668);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x10e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_668);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_668);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  local_688 = 0xf;
  ST::string::from_validated(&local_6b0,"AQIDBAUGBwgJCgsMDQ4P",0x14);
  local_690 = ST::base64_decode(&local_6b0,(void *)0x0,0);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_680,"static_cast<ST_ssize_t>(sizeof(data_15))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4P\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4P\") - 1), nullptr, 0)"
             ,&local_688,&local_690);
  ST::string::~string(&local_6b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x111,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_6b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
  local_6d8 = 0xf;
  ST::string::from_validated(&local_700,"AQIDBAUGBwgJCgsMDQ4P",0x14);
  local_6e0 = ST::base64_decode(&local_700,&gtest_ar.message_,0x40);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_6d0,"static_cast<ST_ssize_t>(sizeof(data_15))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4P\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4P\") - 1), buffer, sizeof(buffer))"
             ,&local_6d8,&local_6e0);
  ST::string::~string(&local_700);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d0);
  if (!bVar1) {
    testing::Message::Message(&local_708);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x113,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_708);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
  ST::buffer<char>::buffer(&local_740,(char *)"\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f",0xf);
  ST::buffer<char>::buffer(&local_760,(char *)&gtest_ar.message_,0xf);
  testing::internal::EqHelper::Compare<ST::buffer<char>,_ST::buffer<char>,_nullptr>
            ((EqHelper *)local_720,
             "ST::char_buffer(reinterpret_cast<const char *>(data_15), sizeof((data_15)))",
             "ST::char_buffer(buffer, sizeof(data_15))",&local_740,&local_760);
  ST::buffer<char>::~buffer(&local_760);
  ST::buffer<char>::~buffer(&local_740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_720);
  if (!bVar1) {
    testing::Message::Message(&local_768);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_720);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x114,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_768);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_768);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_720);
  local_788 = 0x10;
  ST::string::from_validated(&local_7b0,"AQIDBAUGBwgJCgsMDQ4PEA==",0x18);
  local_790 = ST::base64_decode(&local_7b0,(void *)0x0,0);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_780,"static_cast<ST_ssize_t>(sizeof(data_16))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4PEA==\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4PEA==\") - 1), nullptr, 0)"
             ,&local_788,&local_790);
  ST::string::~string(&local_7b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_780);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_780);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_7b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_780);
  local_7d8 = 0x10;
  ST::string::from_validated(&local_800,"AQIDBAUGBwgJCgsMDQ4PEA==",0x18);
  local_7e0 = ST::base64_decode(&local_800,&gtest_ar.message_,0x40);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_7d0,"static_cast<ST_ssize_t>(sizeof(data_16))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4PEA==\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4PEA==\") - 1), buffer, sizeof(buffer))"
             ,&local_7d8,&local_7e0);
  ST::string::~string(&local_800);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
  if (!bVar1) {
    testing::Message::Message(&local_808);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_808);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_808);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
  ST::buffer<char>::buffer
            (&local_840,(char *)"\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10",0x10);
  ST::buffer<char>::buffer(&local_860,(char *)&gtest_ar.message_,0x10);
  testing::internal::EqHelper::Compare<ST::buffer<char>,_ST::buffer<char>,_nullptr>
            ((EqHelper *)local_820,
             "ST::char_buffer(reinterpret_cast<const char *>(data_16), sizeof((data_16)))",
             "ST::char_buffer(buffer, sizeof(data_16))",&local_840,&local_860);
  ST::buffer<char>::~buffer(&local_860);
  ST::buffer<char>::~buffer(&local_840);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_820);
  if (!bVar1) {
    testing::Message::Message(&local_868);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_820);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x119,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_868);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_820);
  local_888 = 0x11;
  ST::string::from_validated(&local_8b0,"AQIDBAUGBwgJCgsMDQ4PEBE=",0x18);
  local_890 = ST::base64_decode(&local_8b0,(void *)0x0,0);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_880,"static_cast<ST_ssize_t>(sizeof(data_17))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4PEBE=\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4PEBE=\") - 1), nullptr, 0)"
             ,&local_888,&local_890);
  ST::string::~string(&local_8b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_880);
  if (!bVar1) {
    testing::Message::Message(&local_8b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_880);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_880);
  local_8d8 = 0x11;
  ST::string::from_validated(&local_900,"AQIDBAUGBwgJCgsMDQ4PEBE=",0x18);
  local_8e0 = ST::base64_decode(&local_900,&gtest_ar.message_,0x40);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_8d0,"static_cast<ST_ssize_t>(sizeof(data_17))",
             "ST::base64_decode(ST::string::from_validated(\"\" \"AQIDBAUGBwgJCgsMDQ4PEBE=\" \"\", sizeof(\"AQIDBAUGBwgJCgsMDQ4PEBE=\") - 1), buffer, sizeof(buffer))"
             ,&local_8d8,&local_8e0);
  ST::string::~string(&local_900);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar1) {
    testing::Message::Message(&local_908);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x11d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_908);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  ST::buffer<char>::buffer
            (&local_940,(char *)"\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11",0x11);
  ST::buffer<char>::buffer(&local_960,(char *)&gtest_ar.message_,0x11);
  testing::internal::EqHelper::Compare<ST::buffer<char>,_ST::buffer<char>,_nullptr>
            ((EqHelper *)local_920,
             "ST::char_buffer(reinterpret_cast<const char *>(data_17), sizeof((data_17)))",
             "ST::char_buffer(buffer, sizeof(data_17))",&local_940,&local_960);
  ST::buffer<char>::~buffer(&local_960);
  ST::buffer<char>::~buffer(&local_940);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_920);
  if (!bVar1) {
    testing::Message::Message(&local_968);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_920);
    testing::internal::AssertHelper::AssertHelper
              (&local_970,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_codecs.cpp"
               ,0x11e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_970,&local_968);
    testing::internal::AssertHelper::~AssertHelper(&local_970);
    testing::Message::~Message(&local_968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_920);
  return;
}

Assistant:

TEST(codecs, base64_decode_buffer)
{
    char buffer[64];

    EXPECT_EQ(0, ST::base64_decode(ST::string(), nullptr, 0));
    EXPECT_EQ(0, ST::base64_decode(ST::string(), buffer, sizeof(buffer)));
    EXPECT_EQ(empty_buf, ST::char_buffer(buffer, 0));

    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_base64_ranges)),
        ST::base64_decode(ST_LITERAL("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"),
                          nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_base64_ranges)),
        ST::base64_decode(ST_LITERAL("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"),
                          buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_base64_ranges), ST::char_buffer(buffer, sizeof(data_base64_ranges)));

    char tight_buffer[4];
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(tight_buffer)),
              ST::base64_decode(ST_LITERAL("AQIDBA=="), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(tight_buffer)),
              ST::base64_decode(ST_LITERAL("AQIDBA=="), tight_buffer, sizeof(tight_buffer)));
    EXPECT_EQ(cbuf(data_4), ST::char_buffer(tight_buffer, sizeof(tight_buffer)));

    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_1)),
              ST::base64_decode(ST_LITERAL("AQ=="), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_1)),
              ST::base64_decode(ST_LITERAL("AQ=="), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_1), ST::char_buffer(buffer, sizeof(data_1)));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_2)),
              ST::base64_decode(ST_LITERAL("AQI="), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_2)),
              ST::base64_decode(ST_LITERAL("AQI="), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_2), ST::char_buffer(buffer, sizeof(data_2)));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_3)),
              ST::base64_decode(ST_LITERAL("AQID"), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_3)),
              ST::base64_decode(ST_LITERAL("AQID"), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_3), ST::char_buffer(buffer, sizeof(data_3)));

    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_15)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4P"), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_15)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4P"), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_15), ST::char_buffer(buffer, sizeof(data_15)));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_16)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4PEA=="), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_16)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4PEA=="), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_16), ST::char_buffer(buffer, sizeof(data_16)));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_17)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4PEBE="), nullptr, 0));
    EXPECT_EQ(static_cast<ST_ssize_t>(sizeof(data_17)),
              ST::base64_decode(ST_LITERAL("AQIDBAUGBwgJCgsMDQ4PEBE="), buffer, sizeof(buffer)));
    EXPECT_EQ(cbuf(data_17), ST::char_buffer(buffer, sizeof(data_17)));
}